

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<
          (ChArchiveOut *this,ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *bVal)

{
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_28;
  
  local_28._name = bVal->_name;
  local_28._value = bVal->_value;
  local_28._flags = bVal->_flags;
  out<Eigen::Matrix<double,_1,_1,1,_1,_1>>(this,&local_28);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }